

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::formatValue<std::atomic<int>>
               (ostream *out,char *param_2,char *fmtEnd,int ntrunc,atomic<int> *value)

{
  __int_type _Var1;
  int in_ECX;
  long in_RDX;
  atomic<int> *in_RDI;
  __atomic_base<int> *in_R8;
  long in_FS_OFFSET;
  int unaff_retaddr;
  bool canConvertToVoidPtr;
  bool canConvertToChar;
  atomic<int> *in_stack_ffffffffffffffc0;
  uint6 in_stack_ffffffffffffffc8;
  ostream *out_00;
  
  out_00 = *(ostream **)(in_FS_OFFSET + 0x28);
  if (*(char *)(in_RDX + -1) == 'c') {
    detail::formatValueAsType<std::atomic<int>,_char,_true>::invoke
              ((ostream *)CONCAT17(1,(uint7)in_stack_ffffffffffffffc8),in_stack_ffffffffffffffc0);
  }
  else if (in_ECX < 0) {
    _Var1 = std::__atomic_base::operator_cast_to_int(in_R8);
    std::ostream::operator<<(in_RDI,_Var1);
  }
  else {
    detail::formatTruncated<std::atomic<int>>(out_00,in_RDI,unaff_retaddr);
  }
  if (*(ostream **)(in_FS_OFFSET + 0x28) != out_00) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

inline void formatValue(std::ostream& out, const char* /*fmtBegin*/,
                        const char* fmtEnd, int ntrunc, const T& value)
{
#ifndef TINYFORMAT_ALLOW_WCHAR_STRINGS
    // Since we don't support printing of wchar_t using "%ls", make it fail at
    // compile time in preference to printing as a void* at runtime.
    typedef typename detail::is_wchar<T>::tinyformat_wchar_is_not_supported DummyType;
    (void) DummyType(); // avoid unused type warning with gcc-4.8
#endif
    // The mess here is to support the %c and %p conversions: if these
    // conversions are active we try to convert the type to a char or const
    // void* respectively and format that instead of the value itself.  For the
    // %p conversion it's important to avoid dereferencing the pointer, which
    // could otherwise lead to a crash when printing a dangling (const char*).
    const bool canConvertToChar = detail::is_convertible<T,char>::value;
    const bool canConvertToVoidPtr = detail::is_convertible<T, const void*>::value;
    if (canConvertToChar && *(fmtEnd-1) == 'c')
        detail::formatValueAsType<T, char>::invoke(out, value);
    else if (canConvertToVoidPtr && *(fmtEnd-1) == 'p')
        detail::formatValueAsType<T, const void*>::invoke(out, value);
#ifdef TINYFORMAT_OLD_LIBSTDCPLUSPLUS_WORKAROUND
    else if (detail::formatZeroIntegerWorkaround<T>::invoke(out, value)) /**/;
#endif
    else if (ntrunc >= 0) {
        // Take care not to overread C strings in truncating conversions like
        // "%.4s" where at most 4 characters may be read.
        detail::formatTruncated(out, value, ntrunc);
    }
    else
        out << value;
}